

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::HairSetNode> *mesh,ssize_t id)

{
  RTCGeometryType RVar1;
  pointer pHVar2;
  MaterialNode *pMVar3;
  size_t i;
  ulong uVar4;
  HairSetNode *pHVar5;
  runtime_error *this_00;
  int __oflag;
  int __oflag_00;
  pointer pvVar6;
  pointer pvVar7;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  pointer vec;
  pointer vec_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  Ref<embree::SceneGraph::MaterialNode> local_1a0;
  string str_type;
  vector<int,_std::allocator<int>_> hairid;
  vector<int,_std::allocator<int>_> indices;
  string str_subtype;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&str_type,"",(allocator *)&str_subtype);
  std::__cxx11::string::string((string *)&str_subtype,"",(allocator *)&local_1c0);
  RVar1 = mesh->ptr->type;
  switch(RVar1) {
  case RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE:
    break;
  case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE|RTC_GEOMETRY_TYPE_QUAD:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
switchD_00188329_caseD_1b:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid curve type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE:
  case RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE:
    std::__cxx11::string::assign((char *)&str_type);
    goto LAB_00188392;
  case RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE:
    break;
  case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE:
  case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE:
    std::__cxx11::string::assign((char *)&str_type);
    goto LAB_00188392;
  default:
    if (RVar1 != RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE) goto switchD_00188329_caseD_1b;
  }
  std::__cxx11::string::assign((char *)&str_type);
LAB_00188392:
  std::__cxx11::string::assign((char *)&str_subtype);
  std::vector<int,_std::allocator<int>_>::vector
            (&indices,(long)(mesh->ptr->hairs).
                            super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(mesh->ptr->hairs).
                            super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&local_1c0);
  std::vector<int,_std::allocator<int>_>::vector
            (&hairid,(long)(mesh->ptr->hairs).
                           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(mesh->ptr->hairs).
                           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&local_1c0);
  for (uVar4 = 0;
      pHVar2 = (mesh->ptr->hairs).
               super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(mesh->ptr->hairs).
                            super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar2 >> 3);
      uVar4 = uVar4 + 1) {
    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar4] = pHVar2[uVar4].vertex;
    hairid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar4] = (mesh->ptr->hairs).
              super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar4].id;
  }
  std::operator+(&local_88,"Curves type=\"",&str_subtype);
  std::operator+(&local_68,&local_88,"\" basis=\"");
  std::operator+(&local_1c0,&local_68,&str_type);
  std::operator+(&local_48,&local_1c0,"\"");
  open(this,(char *)&local_48,(int)id);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  pMVar3 = (mesh->ptr->material).ptr;
  local_1a0.ptr = pMVar3;
  if (pMVar3 != (MaterialNode *)0x0) {
    (*(pMVar3->super_Node).super_RefCount._vptr_RefCount[2])(pMVar3);
  }
  store(this,&local_1a0);
  if (pMVar3 != (MaterialNode *)0x0) {
    (*(pMVar3->super_Node).super_RefCount._vptr_RefCount[3])(pMVar3);
  }
  vec = (mesh->ptr->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (mesh->ptr->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pvVar6 - (long)vec != 0x20) {
    std::__cxx11::string::string(local_a8,"animated_positions",(allocator *)&local_1c0);
    open(this,(char *)local_a8,__oflag);
    std::__cxx11::string::~string(local_a8);
    vec = (mesh->ptr->positions).
          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (mesh->ptr->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; vec != pvVar6; vec = vec + 1) {
    store(this,"positions",vec);
  }
  pHVar5 = mesh->ptr;
  if ((long)(pHVar5->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pHVar5->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    std::__cxx11::string::string(local_c8,"animated_positions",(allocator *)&local_1c0);
    close(this,(int)local_c8);
    std::__cxx11::string::~string(local_c8);
    pHVar5 = mesh->ptr;
  }
  vec_00 = (pHVar5->normals).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (pHVar5->normals).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar7 != vec_00) {
    if ((long)(pHVar5->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pHVar5->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      std::__cxx11::string::string(local_e8,"animated_normals",(allocator *)&local_1c0);
      open(this,(char *)local_e8,__oflag_00);
      std::__cxx11::string::~string(local_e8);
      vec_00 = (mesh->ptr->normals).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar7 = (mesh->ptr->normals).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; vec_00 != pvVar7; vec_00 = vec_00 + 1) {
      store(this,"normals",vec_00);
    }
    if ((long)(mesh->ptr->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(mesh->ptr->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      std::__cxx11::string::string(local_108,"animated_normals",(allocator *)&local_1c0);
      close(this,(int)local_108);
      std::__cxx11::string::~string(local_108);
    }
  }
  store<int>(this,"indices",&indices);
  store<int>(this,"hairid",&hairid);
  std::__cxx11::string::string(local_128,"Curves",(allocator *)&local_1c0);
  close(this,(int)local_128);
  std::__cxx11::string::~string(local_128);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&hairid.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indices.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&str_subtype);
  std::__cxx11::string::~string((string *)&str_type);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::HairSetNode> mesh, ssize_t id)
  {
    std::string str_type = "";
    std::string str_subtype = "";

    switch (mesh->type) {
    case RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE:
      str_type = "linear";
      str_subtype = "flat";
      break;

    case RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE:
      str_type = "bezier";
      str_subtype = "round";
      break;

    case RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE:
      str_type = "bezier";
      str_subtype = "flat";
      break;

    case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE:
      str_type = "bezier";
      str_subtype = "oriented";
      break;

    case RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE:
      str_type = "bspline";
      str_subtype = "round";
      break;

    case RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE:
      str_type = "bspline";
      str_subtype = "flat";
      break;

    case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE:
      str_type = "bspline";
      str_subtype = "oriented";
      break;

    default:
      throw std::runtime_error("invalid curve type");
    }

    std::vector<int> indices(mesh->hairs.size());
    std::vector<int> hairid(mesh->hairs.size());
    for (size_t i=0; i<mesh->hairs.size(); i++) {
      indices[i] = mesh->hairs[i].vertex;
      hairid[i] = mesh->hairs[i].id;
    }
    
    open("Curves type=\""+str_subtype+"\" basis=\""+str_type+"\"",id);
    store(mesh->material);
    if (mesh->numTimeSteps() != 1) open("animated_positions");
    for (const auto& p : mesh->positions) store("positions",p);
    if (mesh->numTimeSteps() != 1) close("animated_positions");
    if (mesh->normals.size()) {
      if (mesh->numTimeSteps() != 1) open("animated_normals");
      for (const auto& p : mesh->normals) store("normals",p);
      if (mesh->numTimeSteps() != 1) close("animated_normals");
    }
    store("indices",indices);
    store("hairid",hairid);
    close("Curves");
  }